

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O2

bool __thiscall minihttp::SocketSet::update(SocketSet *this)

{
  TcpSocket *this_00;
  bool bVar1;
  int iVar2;
  iterator __position;
  _Base_ptr p_Var3;
  bool bVar4;
  _Self __tmp;
  
  bVar4 = false;
  __position._M_node = *(_Base_ptr *)&this->field_0x20;
  do {
    while( true ) {
      if (__position._M_node == (_Base_ptr)&this->field_0x10) {
        return bVar4;
      }
      this_00 = *(TcpSocket **)(__position._M_node + 1);
      bVar1 = TcpSocket::update(this_00);
      bVar4 = (bool)(bVar4 | bVar1);
      if ((*(char *)&__position._M_node[1]._M_parent == '\x01') && (this_00->_s == -1)) break;
LAB_00108df4:
      __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    }
    iVar2 = (*this_00->_vptr_TcpSocket[2])(this_00);
    if ((char)iVar2 != '\0') goto LAB_00108df4;
    (*this_00->_vptr_TcpSocket[1])(this_00);
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    std::
    _Rb_tree<minihttp::TcpSocket*,std::pair<minihttp::TcpSocket*const,minihttp::SocketSet::SocketSetData>,std::_Select1st<std::pair<minihttp::TcpSocket*const,minihttp::SocketSet::SocketSetData>>,std::less<minihttp::TcpSocket*>,std::allocator<std::pair<minihttp::TcpSocket*const,minihttp::SocketSet::SocketSetData>>>
    ::erase_abi_cxx11_((_Rb_tree<minihttp::TcpSocket*,std::pair<minihttp::TcpSocket*const,minihttp::SocketSet::SocketSetData>,std::_Select1st<std::pair<minihttp::TcpSocket*const,minihttp::SocketSet::SocketSetData>>,std::less<minihttp::TcpSocket*>,std::allocator<std::pair<minihttp::TcpSocket*const,minihttp::SocketSet::SocketSetData>>>
                        *)&this->_store,__position);
    __position._M_node = p_Var3;
  } while( true );
}

Assistant:

bool SocketSet::update(void)
{
    bool interesting = false;
    Store::iterator it = _store.begin();
    for( ; it != _store.end(); )
    {
        TcpSocket *sock =  it->first;
        SocketSetData& sdata = it->second;
        interesting = sock->update() || interesting;
        if(sdata.deleteWhenDone && !sock->isOpen() && !sock->HasPendingTask())
        {
            traceprint("Delete socket\n");
            delete sock;
            _store.erase(it++);
        }
        else
           ++it;
    }
    return interesting;
}